

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzip.c
# Opt level: O1

void do_process(h2o_compress_context_t *_self,h2o_iovec_t *inbufs,size_t inbufcnt,
               h2o_send_state_t state,h2o_iovec_t **outbufs,size_t *outbufcnt,processor proc)

{
  size_t bufindex;
  size_t sVar1;
  size_t *psVar2;
  char *pcVar3;
  long lVar4;
  
  pcVar3 = _self[6].name.base;
  pcVar3[8] = '\0';
  pcVar3[9] = '\0';
  pcVar3[10] = '\0';
  pcVar3[0xb] = '\0';
  pcVar3[0xc] = '\0';
  pcVar3[0xd] = '\0';
  pcVar3[0xe] = '\0';
  pcVar3[0xf] = '\0';
  if (inbufcnt == 0) {
    pcVar3 = (char *)0x0;
    sVar1 = 0;
    bufindex = 0;
  }
  else {
    if (inbufcnt == 1) {
      lVar4 = 0;
      bufindex = 0;
    }
    else {
      psVar2 = &inbufs->len;
      bufindex = 0;
      lVar4 = 0;
      do {
        bufindex = process_chunk((st_gzip_context_t *)_self,((h2o_iovec_t *)(psVar2 + -1))->base,
                                 *psVar2,0,bufindex,proc);
        lVar4 = lVar4 + 1;
        psVar2 = psVar2 + 2;
      } while (inbufcnt - 1 != lVar4);
    }
    pcVar3 = inbufs[lVar4].base;
    sVar1 = inbufs[lVar4].len;
  }
  sVar1 = process_chunk((st_gzip_context_t *)_self,pcVar3,sVar1,
                        (state != H2O_SEND_STATE_IN_PROGRESS) + 2 +
                        (uint)(state != H2O_SEND_STATE_IN_PROGRESS),bufindex,proc);
  *outbufs = (h2o_iovec_t *)_self[6].name.base;
  *outbufcnt = sVar1 + 1;
  if (state != H2O_SEND_STATE_IN_PROGRESS) {
    if (_self->transform == do_compress) {
      deflateEnd(_self + 1);
    }
    else {
      inflateEnd();
    }
    *(undefined4 *)&_self[5].transform = 0;
  }
  return;
}

Assistant:

static void do_process(h2o_compress_context_t *_self, h2o_iovec_t *inbufs, size_t inbufcnt, h2o_send_state_t state,
                       h2o_iovec_t **outbufs, size_t *outbufcnt, processor proc)
{
    struct st_gzip_context_t *self = (void *)_self;
    size_t outbufindex;
    h2o_iovec_t last_buf;

    outbufindex = 0;
    self->bufs.entries[0].len = 0;

    if (inbufcnt != 0) {
        size_t i;
        for (i = 0; i != inbufcnt - 1; ++i)
            outbufindex = process_chunk(self, inbufs[i].base, inbufs[i].len, Z_NO_FLUSH, outbufindex, proc);
        last_buf = inbufs[i];
    } else {
        last_buf = h2o_iovec_init(NULL, 0);
    }
    outbufindex = process_chunk(self, last_buf.base, last_buf.len, h2o_send_state_is_in_progress(state) ? Z_SYNC_FLUSH : Z_FINISH,
                                outbufindex, proc);

    *outbufs = self->bufs.entries;
    *outbufcnt = outbufindex + 1;

    if (!h2o_send_state_is_in_progress(state)) {
        if (self->super.transform == do_compress) {
            deflateEnd(&self->zs);
        } else {
            inflateEnd(&self->zs);
        }
        self->zs_is_open = 0;
    }
}